

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_tree.cpp
# Opt level: O2

void si9ma::BinaryTree::print_tree(TreeNode *head)

{
  ostream *poVar1;
  allocator local_31;
  string local_30;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Binary Tree");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string((string *)&local_30,"H",&local_31);
  print_in_order(head,0,0x11,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void BinaryTree::print_tree(const TreeNode *head) {
        cout << "Binary Tree" << endl;
        print_in_order(head,0,17,"H");
        cout << endl;
    }